

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT CreateParserState(LPCSTR fileContents,size_t fileLength,
                         JsFinalizeCallback fileContentsFinalizeCallback,LPCWSTR fullPath)

{
  JsErrorCode jsErrorCode_00;
  int iVar1;
  BOOL BVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  int num;
  unsigned_long scratchLen;
  undefined4 uStack_58;
  char scratch [3];
  DWORD written;
  uint BYTES_PER_LINE;
  uint i;
  JsErrorCode jsErrorCode;
  uint bufferSize;
  BYTE *buffer;
  JsValueRef parserStateBuffer;
  HANDLE fileHandle;
  LPCWSTR pWStack_28;
  HRESULT hr;
  LPCWSTR fullPath_local;
  JsFinalizeCallback fileContentsFinalizeCallback_local;
  size_t fileLength_local;
  LPCSTR fileContents_local;
  
  fileHandle._4_4_ = 0;
  parserStateBuffer = (JsValueRef)0x0;
  buffer = (BYTE *)0x0;
  _jsErrorCode = (BYTE *)0x0;
  i = 0;
  pWStack_28 = fullPath;
  fullPath_local = (LPCWSTR)fileContentsFinalizeCallback;
  fileContentsFinalizeCallback_local = (JsFinalizeCallback)fileLength;
  fileLength_local = (size_t)fileContents;
  fileHandle._4_4_ = GetParserStateBuffer(fileContents,fileContentsFinalizeCallback,&buffer);
  if (-1 < fileHandle._4_4_) {
    jsErrorCode_00 = ChakraRTInterface::JsGetArrayBufferStorage(buffer,(BYTE **)&jsErrorCode,&i);
    if (jsErrorCode_00 == JsNoError) {
      parserStateBuffer = GetFileHandle(pWStack_28);
      if (((undefined1 *)parserStateBuffer == &DAT_ffffffffffffffff) ||
         ((undefined1 *)parserStateBuffer == (undefined1 *)0x0)) {
        fileHandle._4_4_ = -0x7fffbffb;
      }
      else {
        for (written = 0; written < i; written = written + 1) {
          uStack_58 = 0x20;
          scratchLen._4_4_ = 0;
          iVar1 = _snprintf_unsafe((char *)((long)&scratchLen + 1),3,3,"%02X",
                                   (ulong)_jsErrorCode[written]);
          if (iVar1 != 2) {
            pPVar3 = PAL_get_stderr(0);
            PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
                        ,0x267,"num == 2");
            pPVar3 = PAL_get_stderr(0);
            PAL_fflush(pPVar3);
            DebugBreak();
          }
          BVar2 = WriteFile(parserStateBuffer,(LPCVOID)((long)&scratchLen + 1),2,
                            (LPDWORD)((long)&scratchLen + 4),(LPOVERLAPPED)0x0);
          if (BVar2 == 0) {
            fileHandle._4_4_ = -0x7fffbffb;
            break;
          }
          if ((((written & 0x1f) == 0x1f) && (written < i - 1)) &&
             (BVar2 = WriteFile(parserStateBuffer,"\n",1,(LPDWORD)((long)&scratchLen + 4),
                                (LPOVERLAPPED)0x0), BVar2 == 0)) {
            fileHandle._4_4_ = -0x7fffbffb;
            break;
          }
        }
      }
    }
    else {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode_00);
      PAL_fwprintf(pPVar3,
                   L"ERROR: ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)jsErrorCode_00,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
  }
  if (parserStateBuffer != (JsValueRef)0x0) {
    CloseHandle(parserStateBuffer);
  }
  return fileHandle._4_4_;
}

Assistant:

HRESULT CreateParserState(LPCSTR fileContents, size_t fileLength, JsFinalizeCallback fileContentsFinalizeCallback, LPCWSTR fullPath)
{
    HRESULT hr = S_OK;
    HANDLE fileHandle = nullptr;
    JsValueRef parserStateBuffer = nullptr;
    BYTE *buffer = nullptr;
    unsigned int bufferSize = 0;

    IfFailedGoLabel(GetParserStateBuffer(fileContents, fileContentsFinalizeCallback, &parserStateBuffer), Error);
    IfJsErrorFailLog(ChakraRTInterface::JsGetArrayBufferStorage(parserStateBuffer, &buffer, &bufferSize));

    fileHandle = GetFileHandle(fullPath);
    IfFalseGo(fileHandle != INVALID_HANDLE_VALUE && fileHandle != nullptr);

    for (unsigned int i = 0; i < bufferSize; i++)
    {
        const unsigned int BYTES_PER_LINE = 32;
        DWORD written = 0;
        char scratch[3];
        auto scratchLen = sizeof(scratch);
        int num = _snprintf_s(scratch, scratchLen, _countof(scratch), "%02X", buffer[i]);
        Assert(num == 2);
        IfFalseGo(WriteFile(fileHandle, scratch, (DWORD)(scratchLen - 1), &written, nullptr));

        // Add line breaks so this block can be readable
        if (i % BYTES_PER_LINE == (BYTES_PER_LINE - 1) && i < bufferSize - 1)
        {
            IfFalseGo(WriteFile(fileHandle, "\n", 1, &written, nullptr));
        }
    }

Error:
    if (fileHandle != nullptr)
    {
        CloseHandle(fileHandle);
    }
    return hr;
}